

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  initializer_list<const_char_*> iVar1;
  undefined8 this_00;
  bool bVar2;
  int iVar3;
  Edition minimum_edition;
  Edition maximum_edition;
  ulong uVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  reference ppFVar7;
  LogMessage *pLVar8;
  const_reference ppFVar9;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar10;
  reference this_02;
  FileDescriptor *pFVar11;
  FileDescriptorProto *this_03;
  DescriptorPool *pool_00;
  Version *this_04;
  size_t sVar12;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  program;
  string *psVar13;
  GeneratedCodeInfo *pGVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer stream;
  uint64_t uVar15;
  Arg *a0;
  Arg *a1;
  string_view sVar16;
  string_view format;
  bool local_451;
  bool success;
  undefined1 local_440 [8];
  CodedOutputStream writer;
  basic_string_view<char,_std::char_traits<char>_> local_3c0;
  string local_3b0;
  string local_390 [8];
  string filename;
  File *output_file;
  int i;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  current_output;
  Arg local_350;
  Arg local_320;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  string local_2e0;
  undefined1 local_2c0 [8];
  string communicate_error;
  Subprocess subprocess;
  Version *version;
  FileDescriptor *file_1;
  FileDescriptorProto *file_proto;
  iterator __end2_1;
  iterator __begin2_1;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *__range2_1;
  char *local_248;
  char *pcStack_240;
  char *local_238;
  char *pcStack_230;
  iterator local_220;
  size_type local_218;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20b;
  undefined1 local_20a [2];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  undefined1 local_1f8 [8];
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_to_generate;
  DescriptorPool *pool;
  LogMessage local_1c8;
  Voidify local_1b4;
  TransitiveDependencyOptions local_1b3;
  string_view local_1b0;
  FileDescriptor *local_1a0;
  FileDescriptor *file;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  undefined1 local_158 [7];
  bool bootstrap;
  string processed_parameter;
  undefined1 local_128 [8];
  CodeGeneratorResponse response;
  CodeGeneratorRequest request;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  string *plugin_name_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  request.field_0._impl_.compiler_version_ = (Version *)error;
  CodeGeneratorRequest::CodeGeneratorRequest
            ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30));
  CodeGeneratorResponse::CodeGeneratorResponse((CodeGeneratorResponse *)local_128);
  std::__cxx11::string::string((string *)local_158,(string *)parameter);
  already_seen.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0xf] = anon_unknown_5::GetBootstrapParam((string *)local_158);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    puVar5 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&request.super_Message.super_MessageLite._internal_metadata_,0
                       );
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    pAVar6 = MessageLite::GetArena((MessageLite *)((long)&response.field_0 + 0x30));
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)
               &request.field_0._impl_.source_file_descriptors_.super_RepeatedPtrFieldBase.arena_,
               (string *)local_158,pAVar6);
  }
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::flat_hash_set((flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&__range2);
  __end2 = std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::begin(parsed_files);
  file = (FileDescriptor *)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end(parsed_files);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                *)&file);
    if (!bVar2) break;
    ppFVar7 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
              ::operator*(&__end2);
    local_1a0 = *ppFVar7;
    sVar16 = FileDescriptor::name(local_1a0);
    local_1b0 = sVar16;
    CodeGeneratorRequest::add_file_to_generate<std::basic_string_view<char,std::char_traits<char>>>
              ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30),&local_1b0);
    pFVar11 = local_1a0;
    pRVar10 = CodeGeneratorRequest::mutable_proto_file
                        ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30));
    local_1b3.include_json_name = true;
    local_1b3.include_source_code_info = true;
    local_1b3.retain_options = true;
    GetTransitiveDependencies
              (this,pFVar11,
               (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&__range2,pRVar10,&local_1b3);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  bVar2 = std::
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::empty(parsed_files);
  if (bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0xafb,"!parsed_files.empty()");
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1c8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b4,pLVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_1c8);
  }
  ppFVar9 = std::
            vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::operator[](parsed_files,0);
  files_to_generate.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)FileDescriptor::pool(*ppFVar9);
  local_200._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->input_files_);
  local_208._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->input_files_);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_20b);
  a0 = (Arg *)(local_20a + 1);
  a1 = (Arg *)local_20a;
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  ::
  raw_hash_set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((flat_hash_set<std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              *)local_1f8,local_200,local_208,0,(hasher *)a0,(key_equal *)a1,&local_20b);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_20b);
  if (GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
      ::builtin_plugins_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                                 ::builtin_plugins_abi_cxx11_);
    if (iVar3 != 0) {
      this_01 = (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x20);
      __range2_1._4_1_ = 1;
      local_238 = "protoc-gen-mutable_java";
      pcStack_230 = "protoc-gen-python";
      local_248 = "protoc-gen-cpp";
      pcStack_240 = "protoc-gen-java";
      local_220 = &local_248;
      local_218 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range2_1 + 5));
      iVar1._M_len = local_218;
      iVar1._M_array = local_220;
      a0 = (Arg *)((long)&__range2_1 + 7);
      a1 = (Arg *)((long)&__range2_1 + 6);
      absl::lts_20250127::
      flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::raw_hash_set(this_01,iVar1,0,(hasher *)a0,(key_equal *)a1,
                     (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&__range2_1 + 5));
      __range2_1._4_1_ = 0;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range2_1 + 5));
      GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
      ::builtin_plugins_abi_cxx11_ = this_01;
      __cxa_guard_release(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                           ::builtin_plugins_abi_cxx11_);
    }
  }
  pRVar10 = CodeGeneratorRequest::mutable_proto_file
                      ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30));
  __end2_1 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::begin(pRVar10);
  file_proto = (FileDescriptorProto *)
               RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(pRVar10);
  while( true ) {
    bVar2 = internal::operator!=(&__end2_1,(iterator *)&file_proto);
    if (!bVar2) break;
    this_02 = internal::RepeatedPtrIterator<google::protobuf::FileDescriptorProto>::operator*
                        (&__end2_1);
    psVar13 = FileDescriptorProto::name_abi_cxx11_(this_02);
    bVar2 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
            ::contains<std::__cxx11::string>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                        *)local_1f8,psVar13);
    this_00 = files_to_generate.
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.slot_array;
    if (bVar2) {
      psVar13 = FileDescriptorProto::name_abi_cxx11_(this_02);
      sVar16 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar13);
      pFVar11 = DescriptorPool::FindFileByName((DescriptorPool *)this_00,sVar16);
      this_03 = CodeGeneratorRequest::add_source_file_descriptors
                          ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30));
      FileDescriptorProto::operator=(this_03,this_02);
      FileDescriptor::CopyTo(pFVar11,this_02);
      if ((already_seen.
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.soo_data[0xf] & 1) == 0) {
        FileDescriptor::CopySourceCodeInfoTo(pFVar11,this_02);
        bVar2 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                ::contains<std::__cxx11::string>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                            *)GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                              ::builtin_plugins_abi_cxx11_,plugin_name);
        if (!bVar2) {
          FileDescriptor::CopyJsonNameTo(pFVar11,this_02);
        }
      }
      pool_00 = FileDescriptor::pool(pFVar11);
      StripSourceRetentionOptions(pool_00,this_02);
    }
    internal::RepeatedPtrIterator<google::protobuf::FileDescriptorProto>::operator++(&__end2_1);
  }
  this_04 = CodeGeneratorRequest::mutable_compiler_version
                      ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30));
  Version::set_major(this_04,6);
  Version::set_minor(this_04,0x1f);
  Version::set_patch(this_04,0);
  puVar5 = internal::HasBits<1>::operator[](&(this_04->field_0)._impl_._has_bits_,0);
  *(byte *)puVar5 = (byte)*puVar5 | 1;
  pAVar6 = MessageLite::GetArena((MessageLite *)this_04);
  internal::ArenaStringPtr::Set(&(this_04->field_0)._impl_.suffix_,"-dev",pAVar6);
  Subprocess::Subprocess((Subprocess *)((long)&communicate_error.field_2 + 0xc));
  sVar12 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::count<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->plugins_,plugin_name);
  if (sVar12 == 0) {
    Subprocess::Start((Subprocess *)((long)&communicate_error.field_2 + 0xc),plugin_name,SEARCH_PATH
                     );
  }
  else {
    program = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::
              operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&this->plugins_,plugin_name);
    Subprocess::Start((Subprocess *)((long)&communicate_error.field_2 + 0xc),program,EXACT_NAME);
  }
  std::__cxx11::string::string((string *)local_2c0);
  bVar2 = Subprocess::Communicate
                    ((Subprocess *)((long)&communicate_error.field_2 + 0xc),
                     (Message *)((long)&response.field_0 + 0x30),(Message *)local_128,
                     (string *)local_2c0);
  if (bVar2) {
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                *)&stack0xfffffffffffffca0);
    output_file._4_4_ = 0;
    while( true ) {
      iVar3 = CodeGeneratorResponse::file_size((CodeGeneratorResponse *)local_128);
      if (iVar3 <= output_file._4_4_) break;
      filename.field_2._8_8_ =
           CodeGeneratorResponse::file((CodeGeneratorResponse *)local_128,output_file._4_4_);
      CodeGeneratorResponse_File::insertion_point_abi_cxx11_
                ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        psVar13 = CodeGeneratorResponse_File::name_abi_cxx11_
                            ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
        std::__cxx11::string::string(local_390,(string *)psVar13);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)&stack0xfffffffffffffca0,(pointer)0x0);
        psVar13 = CodeGeneratorResponse_File::insertion_point_abi_cxx11_
                            ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
        pGVar14 = CodeGeneratorResponse_File::generated_code_info
                            ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
        iVar3 = (*generator_context->_vptr_GeneratorContext[5])
                          (generator_context,local_390,psVar13,pGVar14);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)&stack0xfffffffffffffca0,(pointer)CONCAT44(extraout_var,iVar3));
        std::__cxx11::string::~string(local_390);
      }
      else {
        CodeGeneratorResponse_File::name_abi_cxx11_
                  ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)&stack0xfffffffffffffca0,(pointer)0x0);
          psVar13 = CodeGeneratorResponse_File::name_abi_cxx11_
                              ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
          iVar3 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,psVar13);
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)&stack0xfffffffffffffca0,(pointer)CONCAT44(extraout_var_00,iVar3));
        }
        else {
          bVar2 = std::operator==((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                   *)&stack0xfffffffffffffca0,(nullptr_t)0x0);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_3c0,
                       "$0: First file chunk returned by plugin did not specify a file name.");
            absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                      ((Arg *)&writer.start_count_,plugin_name);
            sVar16._M_str = (char *)&writer.start_count_;
            sVar16._M_len = (size_t)local_3c0._M_str;
            absl::lts_20250127::Substitute_abi_cxx11_
                      (&local_3b0,(lts_20250127 *)local_3c0._M_len,sVar16,a0);
            std::__cxx11::string::operator=
                      ((string *)request.field_0._impl_.compiler_version_,(string *)&local_3b0);
            std::__cxx11::string::~string((string *)&local_3b0);
            this_local._7_1_ = false;
            goto LAB_0025738f;
          }
        }
      }
      stream = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                      *)&stack0xfffffffffffffca0);
      io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ZeroCopyOutputStream,void>
                ((CodedOutputStream *)local_440,stream);
      psVar13 = CodeGeneratorResponse_File::content_abi_cxx11_
                          ((CodeGeneratorResponse_File *)filename.field_2._8_8_);
      sVar16 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar13);
      io::CodedOutputStream::WriteString((CodedOutputStream *)local_440,sVar16);
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_440);
      output_file._4_4_ = output_file._4_4_ + 1;
    }
    uVar15 = CodeGeneratorResponse::supported_features((CodeGeneratorResponse *)local_128);
    local_451 = EnforceProto3OptionalSupport(this,plugin_name,uVar15,parsed_files);
    uVar15 = CodeGeneratorResponse::supported_features((CodeGeneratorResponse *)local_128);
    minimum_edition = CodeGeneratorResponse::minimum_edition((CodeGeneratorResponse *)local_128);
    maximum_edition = CodeGeneratorResponse::maximum_edition((CodeGeneratorResponse *)local_128);
    bVar2 = EnforceEditionsSupport
                      (this,plugin_name,uVar15,minimum_edition,maximum_edition,parsed_files);
    if (!bVar2) {
      local_451 = false;
    }
    CodeGeneratorResponse::error_abi_cxx11_((CodeGeneratorResponse *)local_128);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar13 = CodeGeneratorResponse::error_abi_cxx11_((CodeGeneratorResponse *)local_128);
      std::__cxx11::string::operator=
                ((string *)request.field_0._impl_.compiler_version_,(string *)psVar13);
      local_451 = false;
    }
    this_local._7_1_ = local_451;
LAB_0025738f:
    current_output._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl._4_4_ =
         1;
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)&stack0xfffffffffffffca0);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f0,"$0: $1");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_320,plugin_name);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_350,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
    format._M_str = (char *)&local_320;
    format._M_len = (size_t)local_2f0._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_
              (&local_2e0,(lts_20250127 *)local_2f0._M_len,format,&local_350,a1);
    std::__cxx11::string::operator=
              ((string *)request.field_0._impl_.compiler_version_,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    this_local._7_1_ = false;
    current_output._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl._4_4_ =
         1;
  }
  std::__cxx11::string::~string((string *)local_2c0);
  Subprocess::~Subprocess((Subprocess *)((long)&communicate_error.field_2 + 0xc));
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f8);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~flat_hash_set((flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&__range2);
  std::__cxx11::string::~string((string *)local_158);
  CodeGeneratorResponse::~CodeGeneratorResponse((CodeGeneratorResponse *)local_128);
  CodeGeneratorRequest::~CodeGeneratorRequest
            ((CodeGeneratorRequest *)((long)&response.field_0 + 0x30));
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;

  bool bootstrap = GetBootstrapParam(processed_parameter);

  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  absl::flat_hash_set<const FileDescriptor*> already_seen;
  for (const FileDescriptor* file : parsed_files) {
    request.add_file_to_generate(file->name());
    GetTransitiveDependencies(file, &already_seen, request.mutable_proto_file(),
                              {/*.include_json_name =*/true,
                               /*.include_source_code_info =*/true,
                               /*.retain_options =*/true});
  }

  // Populate source_file_descriptors and remove source-retention options from
  // proto_file.
  ABSL_CHECK(!parsed_files.empty());
  const DescriptorPool* pool = parsed_files[0]->pool();
  absl::flat_hash_set<std::string> files_to_generate(input_files_.begin(),
                                                     input_files_.end());
  static const auto builtin_plugins = new absl::flat_hash_set<std::string>(
      {"protoc-gen-cpp", "protoc-gen-java", "protoc-gen-mutable_java",
       "protoc-gen-python"});
  for (FileDescriptorProto& file_proto : *request.mutable_proto_file()) {
    if (files_to_generate.contains(file_proto.name())) {
      const FileDescriptor* file = pool->FindFileByName(file_proto.name());
      *request.add_source_file_descriptors() = std::move(file_proto);
      file->CopyTo(&file_proto);
      // Don't populate source code info or json_name for bootstrap protos.
      if (!bootstrap) {
        file->CopySourceCodeInfoTo(&file_proto);

        // The built-in code generators didn't use the json names.
        if (!builtin_plugins->contains(plugin_name)) {
          file->CopyJsonNameTo(&file_proto);
        }
      }
      StripSourceRetentionOptions(*file->pool(), file_proto);
    }
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = absl::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); ++i) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(
          generator_context->OpenForInsertWithGeneratedCodeInfo(
              filename, output_file.insertion_point(),
              output_file.generated_code_info()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == nullptr) {
      *error = absl::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  bool success = true;
  if (!EnforceProto3OptionalSupport(plugin_name, response.supported_features(),
                                    parsed_files)) {
    success = false;
  }
  if (!EnforceEditionsSupport(plugin_name, response.supported_features(),
                              static_cast<Edition>(response.minimum_edition()),
                              static_cast<Edition>(response.maximum_edition()),
                              parsed_files)) {
    success = false;
  }
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    success = false;
  }

  return success;
}